

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O1

Aig_Obj_t * readLiveSignal_0(Aig_Man_t *pAig,int liveIndex_0)

{
  if ((-1 < liveIndex_0) && (liveIndex_0 < pAig->vCos->nSize)) {
    return *(Aig_Obj_t **)((long)pAig->vCos->pArray[(uint)liveIndex_0] + 8);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline void * Vec_PtrEntry( Vec_Ptr_t * p, int i )
{
    assert( i >= 0 && i < p->nSize );
    return p->pArray[i];
}